

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_tree_init_stream
               (mpack_tree_t *tree,mpack_tree_read_t read_fn,void *context,size_t max_message_size,
               size_t max_message_nodes)

{
  memset(tree,0,0xa0);
  (tree->nil_node).type = mpack_type_nil;
  tree->read_fn = read_fn;
  tree->context = context;
  tree->max_size = max_message_size;
  tree->max_nodes = max_message_nodes;
  return;
}

Assistant:

void mpack_tree_init_stream(mpack_tree_t* tree, mpack_tree_read_t read_fn, void* context,
        size_t max_message_size, size_t max_message_nodes) {
    mpack_tree_init_clear(tree);

    tree->read_fn = read_fn;
    tree->context = context;
    tree->max_size = max_message_size;
    tree->max_nodes = max_message_nodes;

    mpack_log("===========================\n");
    mpack_log("initializing tree with stream, max size %i max nodes %i\n",
            (int)max_message_size, (int)max_message_nodes);
}